

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::AsyncCase::AsyncCase
          (AsyncCase *this,Context *ctx,char *name,char *desc,
          vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
          *errorFuncs,bool useCallbacks)

{
  bool useCallbacks_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  *errorFuncs_local;
  char *desc_local;
  char *name_local;
  Context *ctx_local;
  AsyncCase *this_local;
  
  BaseCase::BaseCase(&this->super_BaseCase,ctx,name,desc);
  (this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__AsyncCase_032ac0e0;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  ::vector(&this->m_errorFuncs,errorFuncs);
  this->m_useCallbacks = useCallbacks;
  std::
  map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>_>
  ::map(&this->m_counts);
  de::Mutex::Mutex(&this->m_mutex,0);
  return;
}

Assistant:

AsyncCase::AsyncCase (Context&								ctx,
					  const char*							name,
					  const char*							desc,
					  const vector<TestFunctionWrapper>&	errorFuncs,
					  bool									useCallbacks)
	: BaseCase			(ctx, name, desc)
	, m_errorFuncs		(errorFuncs)
	, m_useCallbacks	(useCallbacks)
{
}